

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

ConfigCellIdentifierSyntax * __thiscall
slang::parsing::Parser::parseConfigCellIdentifier(Parser *this)

{
  Token library;
  Token library_00;
  Token cell;
  bool bVar1;
  Info *pIVar2;
  long in_RDI;
  Token TVar3;
  Token TVar4;
  Token dot;
  Token id1;
  Token *in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff58;
  undefined6 uVar5;
  TokenKind in_stack_ffffffffffffff5e;
  undefined2 uVar6;
  ParserBase *in_stack_ffffffffffffff60;
  ParserBase *in_stack_ffffffffffffff70;
  Info *in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffffd0 [16];
  ParserBase *in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  TVar3 = ParserBase::expect(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd0._14_2_);
  bVar1 = ParserBase::peek(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5e);
  if (bVar1) {
    TVar4 = ParserBase::consume(in_stack_ffffffffffffff70);
    pIVar2 = (Info *)(in_RDI + 0xe0);
    TVar3 = ParserBase::expect(TVar3._0_8_,TVar4.info._6_2_);
    library.rawLen._2_2_ = in_stack_ffffffffffffff5e;
    library._0_6_ = in_stack_ffffffffffffff58;
    library.info = pIVar2;
    cell.info = in_stack_ffffffffffffff78;
    cell._0_8_ = in_stack_ffffffffffffff70;
    local_8 = slang::syntax::SyntaxFactory::configCellIdentifier
                        ((SyntaxFactory *)0xa5adac,library,TVar3,cell);
  }
  else {
    uVar5 = (undefined6)(in_RDI + 0xe0);
    uVar6 = (undefined2)((ulong)(in_RDI + 0xe0) >> 0x30);
    Token::Token(in_stack_ffffffffffffff50);
    Token::Token(in_stack_ffffffffffffff50);
    library_00.rawLen._2_2_ = uVar6;
    library_00._0_6_ = uVar5;
    library_00.info = (Info *)in_stack_ffffffffffffff60;
    local_8 = slang::syntax::SyntaxFactory::configCellIdentifier
                        ((SyntaxFactory *)0xa5ae27,library_00,TVar3,TVar3);
  }
  return local_8;
}

Assistant:

ConfigCellIdentifierSyntax& Parser::parseConfigCellIdentifier() {
    auto id1 = expect(TokenKind::Identifier);
    if (peek(TokenKind::Dot)) {
        auto dot = consume();
        return factory.configCellIdentifier(id1, dot, expect(TokenKind::Identifier));
    }

    return factory.configCellIdentifier(Token(), Token(), id1);
}